

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SizeT ARM_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  int iVar1;
  uint local_34;
  UInt32 src;
  UInt32 dest;
  SizeT i;
  int encoding_local;
  UInt32 ip_local;
  SizeT size_local;
  Byte *data_local;
  
  if (size < 4) {
    data_local = (Byte *)0x0;
  }
  else {
    for (_src = (Byte *)0x0; _src <= (Byte *)(size - 4); _src = _src + 4) {
      if ((data + 3)[(long)_src] == 0xeb) {
        if (encoding == 0) {
          iVar1 = -(ip + 8 + (int)_src);
        }
        else {
          iVar1 = ip + 8 + (int)_src;
        }
        local_34 = iVar1 + ((uint)(data + 2)[(long)_src] << 0x10 | (uint)(data + 1)[(long)_src] << 8
                           | (uint)data[(long)_src]) * 4;
        local_34 = local_34 >> 2;
        (data + 2)[(long)_src] = (Byte)(local_34 >> 0x10);
        (data + 1)[(long)_src] = (Byte)(local_34 >> 8);
        data[(long)_src] = (Byte)local_34;
      }
    }
    data_local = _src;
  }
  return (SizeT)data_local;
}

Assistant:

static SizeT ARM_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 4)
    return 0;
  size -= 4;
  ip += 8;
  for (i = 0; i <= size; i += 4)
  {
    if (data[i + 3] == 0xEB)
    {
      UInt32 dest;
      UInt32 src = ((UInt32)data[i + 2] << 16) | ((UInt32)data[i + 1] << 8) | (data[i + 0]);
      src <<= 2;
      if (encoding)
        dest = ip + (UInt32)i + src;
      else
        dest = src - (ip + (UInt32)i);
      dest >>= 2;
      data[i + 2] = (Byte)(dest >> 16);
      data[i + 1] = (Byte)(dest >> 8);
      data[i + 0] = (Byte)dest;
    }
  }
  return i;
}